

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSimpleRecurrentLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  uint64_t uVar7;
  uint64 uVar8;
  string *psVar9;
  uint uVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  long *plVar14;
  undefined8 *puVar15;
  LayerUnion LVar16;
  char cVar17;
  WeightParams *pWVar18;
  size_type *psVar19;
  char cVar20;
  ActivationParams *params;
  uint uVar21;
  Result r;
  string err;
  pointer local_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  string local_c8;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [24];
  LayerUnion local_80;
  string local_78;
  string *local_58;
  string local_50;
  
  Result::Result((Result *)&local_f0);
  validateInputCount((Result *)local_a8,layer,2,2);
  local_f0 = (pointer)local_a8;
  std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
  pcVar2 = local_98 + 8;
  if (local_a0._M_p != pcVar2) {
    operator_delete(local_a0._M_p,local_98._8_8_ + 1);
  }
  bVar11 = Result::good((Result *)&local_f0);
  if (bVar11) {
    validateOutputCount((Result *)local_a8,layer,2,2);
    local_f0 = (pointer)local_a8;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
    if (local_a0._M_p != pcVar2) {
      operator_delete(local_a0._M_p,local_98._8_8_ + 1);
    }
  }
  bVar11 = Result::good((Result *)&local_f0);
  if (bVar11) {
    bVar11 = Result::good((Result *)&local_f0);
    if (bVar11) {
      if (this->ndArrayInterpretation != true) {
LAB_002d173b:
        if (layer->_oneof_case_[0] == 400) {
          local_80 = layer->layer_;
        }
        else {
          local_80.simplerecurrent_ = Specification::SimpleRecurrentLayerParams::default_instance();
        }
        pWVar18 = (local_80.innerproduct_)->bias_;
        if (pWVar18 == (WeightParams *)0x0) {
          pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar3 = (pWVar18->floatvalue_).current_size_;
        sVar4 = ((pWVar18->float16value_).ptr_)->_M_string_length;
        uVar21 = (0 < iVar3) + 1;
        if (sVar4 == 0) {
          uVar21 = (uint)(0 < iVar3);
        }
        sVar5 = ((pWVar18->rawvalue_).ptr_)->_M_string_length;
        sVar6 = ((pWVar18->int8rawvalue_).ptr_)->_M_string_length;
        uVar10 = (uint)(sVar6 == 0);
        uVar21 = (uVar21 - (sVar5 == 0)) + 2;
        cVar12 = '\x04';
        if (uVar21 - uVar10 < 2) {
          cVar12 = '\x05';
          if (uVar21 != uVar10) {
            cVar12 = iVar3 < 1;
          }
          if ((((sVar4 == 0) && (iVar3 < 1)) && (uVar21 != uVar10)) &&
             ((((sVar5 == 0 ||
                (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (cVar12 = '\x02', pWVar18->quantization_ == (QuantizationParams *)0x0)) &&
              (((sVar6 == 0 ||
                (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (cVar12 = '\x03', pWVar18->quantization_ == (QuantizationParams *)0x0)))))) {
            cVar12 = '\x05';
          }
        }
        pWVar18 = (local_80.batchnorm_)->mean_;
        if (pWVar18 == (WeightParams *)0x0) {
          pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar3 = (pWVar18->floatvalue_).current_size_;
        sVar4 = ((pWVar18->float16value_).ptr_)->_M_string_length;
        uVar21 = (0 < iVar3) + 1;
        if (sVar4 == 0) {
          uVar21 = (uint)(0 < iVar3);
        }
        sVar5 = ((pWVar18->rawvalue_).ptr_)->_M_string_length;
        sVar6 = ((pWVar18->int8rawvalue_).ptr_)->_M_string_length;
        uVar10 = (uint)(sVar6 == 0);
        uVar21 = (uVar21 - (sVar5 == 0)) + 2;
        cVar17 = '\x04';
        if (uVar21 - uVar10 < 2) {
          cVar17 = '\x05';
          if (uVar21 != uVar10) {
            cVar17 = iVar3 < 1;
          }
          if ((((sVar4 == 0) && (iVar3 < 1)) && (uVar21 != uVar10)) &&
             ((((sVar5 == 0 ||
                (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (cVar17 = '\x02', pWVar18->quantization_ == (QuantizationParams *)0x0)) &&
              (((sVar6 == 0 ||
                (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (cVar17 = '\x03', pWVar18->quantization_ == (QuantizationParams *)0x0)))))) {
            cVar17 = '\x05';
          }
        }
        pWVar18 = (local_80.batchnorm_)->variance_;
        if (pWVar18 == (WeightParams *)0x0) {
          pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        iVar3 = (pWVar18->floatvalue_).current_size_;
        sVar4 = ((pWVar18->float16value_).ptr_)->_M_string_length;
        uVar21 = (0 < iVar3) + 1;
        if (sVar4 == 0) {
          uVar21 = (uint)(0 < iVar3);
        }
        sVar5 = ((pWVar18->rawvalue_).ptr_)->_M_string_length;
        sVar6 = ((pWVar18->int8rawvalue_).ptr_)->_M_string_length;
        uVar10 = (uint)(sVar6 == 0);
        uVar21 = (uVar21 - (sVar5 == 0)) + 2;
        cVar20 = '\x04';
        if (uVar21 - uVar10 < 2) {
          cVar20 = '\x05';
          if (uVar21 != uVar10) {
            cVar20 = iVar3 < 1;
          }
          if (((((sVar4 == 0) && (iVar3 < 1)) && (uVar21 != uVar10)) &&
              (((sVar5 == 0 ||
                (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
               (cVar20 = '\x02', pWVar18->quantization_ == (QuantizationParams *)0x0)))) &&
             (((sVar6 == 0 ||
               (pWVar18 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
              (cVar20 = '\x03', pWVar18->quantization_ == (QuantizationParams *)0x0)))) {
            cVar20 = '\x05';
          }
        }
        if (((cVar12 == '\x04') || (cVar17 == '\x04')) ||
           (bVar11 = (local_80.pooling_)->globalpooling_, (cVar20 == '\x04' & bVar11) != 0)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,"Simple recurrent layer \'",(layer->name_).ptr_);
          puVar15 = (undefined8 *)std::__cxx11::string::append(local_a8);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar19 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_c8.field_2._M_allocated_capacity = *psVar19;
            local_c8.field_2._8_8_ = puVar15[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar19;
            local_c8._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_c8._M_string_length = puVar15[1];
          *puVar15 = psVar19;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          if (local_a8 != (undefined1  [8])local_98) {
            operator_delete((void *)local_a8,local_98._0_8_ + 1);
          }
          Result::Result((Result *)local_a8,INVALID_MODEL_PARAMETERS,&local_c8);
        }
        else {
          if (((cVar12 == '\x02') || (cVar17 == '\x02')) ||
             ((cVar12 == cVar17 && (((cVar20 == '\x02' || (cVar12 == cVar20)) || (bVar11 == false)))
              ))) {
            uVar7 = (local_80.simplerecurrent_)->outputvectorsize_;
            pWVar18 = (local_80.innerproduct_)->bias_;
            if (pWVar18 == (WeightParams *)0x0) {
              pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            uVar8 = (local_80.batchnorm_)->channels_;
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"SimpleRNN","");
            local_58 = (layer->name_).ptr_;
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"WeightMatrix","");
            validateGeneralWeightParams
                      ((Result *)local_a8,pWVar18,uVar8 * uVar7,uVar7,&local_c8,local_58,&local_78);
            local_f0 = (pointer)local_a8;
            std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
            if (local_a0._M_p != local_98 + 8) {
              operator_delete(local_a0._M_p,local_98._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            bVar13 = Result::good((Result *)&local_f0);
            if (bVar13) {
              pWVar18 = (local_80.batchnorm_)->mean_;
              if (pWVar18 == (WeightParams *)0x0) {
                pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              uVar7 = (local_80.simplerecurrent_)->outputvectorsize_;
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"SimpleRNN","");
              psVar9 = (layer->name_).ptr_;
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"RecursionMatrix","");
              validateGeneralWeightParams
                        ((Result *)local_a8,pWVar18,uVar7 * uVar7,uVar7,&local_c8,psVar9,&local_78);
              local_f0 = (pointer)local_a8;
              std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
              if (local_a0._M_p != local_98 + 8) {
                operator_delete(local_a0._M_p,local_98._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              bVar13 = Result::good((Result *)&local_f0);
              if (bVar13) {
                if (bVar11 != false) {
                  pWVar18 = (local_80.batchnorm_)->variance_;
                  if (pWVar18 == (WeightParams *)0x0) {
                    pWVar18 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  uVar7 = (local_80.simplerecurrent_)->outputvectorsize_;
                  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_c8,"SimpleRNN","");
                  psVar9 = (layer->name_).ptr_;
                  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_78,"BiasVector","");
                  validateGeneralWeightParams
                            ((Result *)local_a8,pWVar18,uVar7,1,&local_c8,psVar9,&local_78);
                  local_f0 = (pointer)local_a8;
                  std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
                  if (local_a0._M_p != local_98 + 8) {
                    operator_delete(local_a0._M_p,local_98._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p,
                                    local_c8.field_2._M_allocated_capacity + 1);
                  }
                  bVar11 = Result::good((Result *)&local_f0);
                  if (!bVar11) goto LAB_002d1e61;
                }
                if (layer->_oneof_case_[0] == 400) {
                  LVar16 = layer->layer_;
                }
                else {
                  LVar16.simplerecurrent_ =
                       Specification::SimpleRecurrentLayerParams::default_instance();
                }
                params = (ActivationParams *)((LVar16.activation_)->NonlinearityType_).linear_;
                if (params == (ActivationParams *)0x0) {
                  params = (ActivationParams *)&Specification::_ActivationParams_default_instance_;
                }
                validateRecurrentActivationParams(__return_storage_ptr__,params);
                goto LAB_002d1eaf;
              }
            }
            goto LAB_002d1e61;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,"Simple recurrent layer \'",(layer->name_).ptr_);
          plVar14 = (long *)std::__cxx11::string::append(local_a8);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar19 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar19) {
            local_c8.field_2._M_allocated_capacity = *psVar19;
            local_c8.field_2._8_8_ = plVar14[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar19;
            local_c8._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_c8._M_string_length = plVar14[1];
          *plVar14 = (long)psVar19;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if (local_a8 != (undefined1  [8])local_98) {
            operator_delete((void *)local_a8,local_98._0_8_ + 1);
          }
          Result::Result((Result *)local_a8,INVALID_MODEL_PARAMETERS,&local_c8);
        }
        local_f0 = (pointer)local_a8;
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
        if (local_a0._M_p != pcVar2) {
          operator_delete(local_a0._M_p,local_98._8_8_ + 1);
        }
        *(pointer *)__return_storage_ptr__ = local_f0;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_p == &local_d8) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_d8._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_e8._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_e0;
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_e8._M_p = (pointer)&local_d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002d1eaf;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SimpleRecurrent","");
      validateInputOutputRankEquality((Result *)local_a8,layer,&local_50,&this->blobNameToRank);
      local_f0 = (pointer)local_a8;
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
      if (local_a0._M_p != pcVar2) {
        operator_delete(local_a0._M_p,local_98._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar11 = Result::good((Result *)&local_f0);
      if (bVar11) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"SimpleRecurrent","");
        validateRankCount((Result *)local_a8,layer,&local_c8,5,5,&this->blobNameToRank);
        local_f0 = (pointer)local_a8;
        std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a0);
        if (local_a0._M_p != pcVar2) {
          operator_delete(local_a0._M_p,local_98._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        bVar11 = Result::good((Result *)&local_f0);
        if (bVar11) goto LAB_002d173b;
      }
    }
  }
LAB_002d1e61:
  *(pointer *)__return_storage_ptr__ = local_f0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p == &local_d8) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_d8._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_e8._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_e0;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_e8._M_p = (pointer)&local_d8;
LAB_002d1eaf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,
                    CONCAT71(local_d8._M_allocated_capacity._1_7_,local_d8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    // Must specify hidden state
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 2, 2);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "SimpleRecurrent", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "SimpleRecurrent", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.simplerecurrent();
    bool hasBiasVector = params.hasbiasvector();
    WeightParamType weightMatrixValueType, recursionMatrixValueType, biasVectorValueType;
    weightMatrixValueType = valueType(params.weightmatrix());
    recursionMatrixValueType = valueType(params.recursionmatrix());
    biasVectorValueType = valueType(params.biasvector());

    // Verify all weights are of valid type
    if((weightMatrixValueType == UNSPECIFIED) || recursionMatrixValueType == UNSPECIFIED || (hasBiasVector && biasVectorValueType == UNSPECIFIED)){
        std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    // Verify either weightMatrix, recursionMatrix, and biasVector are all FP32 or FP16, or one of them is quantized
    if (weightMatrixValueType != QUINT && recursionMatrixValueType != QUINT){
        if (weightMatrixValueType != recursionMatrixValueType ||
            (hasBiasVector && biasVectorValueType != QUINT && weightMatrixValueType != biasVectorValueType) ){
            std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields. "
            "Field value types should match and should either be half or full precision.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    // Check weight matrix size
    // input matrix
    uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.weightmatrix(), input_matrix_size,
                                    params.outputvectorsize(),
                                    "SimpleRNN", layer.name(), "WeightMatrix");
    if (!r.good()) return r;
    // recurrent matrix
    uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.recursionmatrix(), recurrent_matrix_size,
                                    params.outputvectorsize(), "SimpleRNN",
                                    layer.name(), "RecursionMatrix");
    if (!r.good()) return r;
    // bias
    if (hasBiasVector){
        r = validateGeneralWeightParams(params.biasvector(), params.outputvectorsize(), 1,
                                        "SimpleRNN", layer.name(), "BiasVector");
        if (!r.good()) return r;
    }
    // Validate the activations as well
    return validateRecurrentActivationParams(layer.simplerecurrent().activation());

}